

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaBuildContentModelForSubstGroup
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaParticlePtr particle,int counter,
              xmlAutomataStatePtr end)

{
  xmlSchemaElementPtr head;
  xmlAutomataStatePtr from;
  void *pvVar1;
  xmlAutomataPtr pxVar2;
  int counter_00;
  xmlSchemaSubstGroupPtr pxVar3;
  xmlNodePtr node;
  xmlAutomataStatePtr pxVar4;
  xmlAutomataStatePtr pxVar5;
  bool bVar6;
  int local_88;
  int local_84;
  int minOccurs;
  int maxOccurs;
  xmlAutomataStatePtr hop;
  int ret;
  int i;
  xmlSchemaSubstGroupPtr substGroup;
  xmlSchemaElementPtr member;
  xmlSchemaElementPtr elemDecl;
  xmlAutomataStatePtr tmp;
  xmlAutomataStatePtr start;
  xmlAutomataStatePtr end_local;
  int counter_local;
  xmlSchemaParticlePtr particle_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  head = (xmlSchemaElementPtr)particle->children;
  from = pctxt->state;
  start = end;
  if (end == (xmlAutomataStatePtr)0x0) {
    start = xmlAutomataNewState(pctxt->am);
  }
  pxVar3 = xmlSchemaSubstGroupGet(pctxt,head);
  if (pxVar3 == (xmlSchemaSubstGroupPtr)0x0) {
    node = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)particle);
    xmlSchemaPErr(pctxt,node,0xbfd,
                  "Internal error: xmlSchemaBuildContentModelForSubstGroup, declaration is marked having a subst. group but none available.\n"
                  ,head->name,(xmlChar *)0x0);
    pctxt_local._4_4_ = 0;
  }
  else {
    if (counter < 0) {
      if (particle->maxOccurs == 1) {
        pxVar2 = pctxt->am;
        pxVar4 = xmlAutomataNewTransition2
                           (pctxt->am,from,(xmlAutomataStatePtr)0x0,head->name,head->targetNamespace
                            ,head);
        xmlAutomataNewEpsilon(pxVar2,pxVar4,start);
        for (hop._4_4_ = 0; hop._4_4_ < pxVar3->members->nbItems; hop._4_4_ = hop._4_4_ + 1) {
          pvVar1 = pxVar3->members->items[hop._4_4_];
          pxVar4 = xmlAutomataNewTransition2
                             (pctxt->am,from,(xmlAutomataStatePtr)0x0,
                              *(xmlChar **)((long)pvVar1 + 0x10),*(xmlChar **)((long)pvVar1 + 0x60),
                              pvVar1);
          xmlAutomataNewEpsilon(pctxt->am,pxVar4,start);
        }
      }
      else {
        if (particle->maxOccurs == 0x40000000) {
          local_84 = 0x40000000;
        }
        else {
          local_84 = particle->maxOccurs + -1;
        }
        if (particle->minOccurs < 1) {
          local_88 = 0;
        }
        else {
          local_88 = particle->minOccurs + -1;
        }
        counter_00 = xmlAutomataNewCounter(pctxt->am,local_88,local_84);
        pxVar4 = xmlAutomataNewState(pctxt->am);
        pxVar2 = pctxt->am;
        pxVar5 = xmlAutomataNewTransition2
                           (pctxt->am,from,(xmlAutomataStatePtr)0x0,head->name,head->targetNamespace
                            ,head);
        xmlAutomataNewEpsilon(pxVar2,pxVar5,pxVar4);
        for (hop._4_4_ = 0; hop._4_4_ < pxVar3->members->nbItems; hop._4_4_ = hop._4_4_ + 1) {
          pvVar1 = pxVar3->members->items[hop._4_4_];
          pxVar2 = pctxt->am;
          pxVar5 = xmlAutomataNewTransition2
                             (pctxt->am,from,(xmlAutomataStatePtr)0x0,
                              *(xmlChar **)((long)pvVar1 + 0x10),*(xmlChar **)((long)pvVar1 + 0x60),
                              pvVar1);
          xmlAutomataNewEpsilon(pxVar2,pxVar5,pxVar4);
        }
        xmlAutomataNewCountedTrans(pctxt->am,pxVar4,from,counter_00);
        xmlAutomataNewCounterTrans(pctxt->am,pxVar4,start,counter_00);
      }
    }
    else {
      pxVar4 = xmlAutomataNewCountedTrans(pctxt->am,from,(xmlAutomataStatePtr)0x0,counter);
      xmlAutomataNewTransition2(pctxt->am,pxVar4,start,head->name,head->targetNamespace,head);
      for (hop._4_4_ = 0; hop._4_4_ < pxVar3->members->nbItems; hop._4_4_ = hop._4_4_ + 1) {
        pvVar1 = pxVar3->members->items[hop._4_4_];
        xmlAutomataNewTransition2
                  (pctxt->am,pxVar4,start,*(xmlChar **)((long)pvVar1 + 0x10),
                   *(xmlChar **)((long)pvVar1 + 0x60),pvVar1);
      }
    }
    bVar6 = particle->minOccurs == 0;
    if (bVar6) {
      xmlAutomataNewEpsilon(pctxt->am,from,start);
    }
    hop._0_4_ = (uint)bVar6;
    pctxt->state = start;
    pctxt_local._4_4_ = (uint)hop;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaBuildContentModelForSubstGroup(xmlSchemaParserCtxtPtr pctxt,
	xmlSchemaParticlePtr particle, int counter, xmlAutomataStatePtr end)
{
    xmlAutomataStatePtr start, tmp;
    xmlSchemaElementPtr elemDecl, member;
    xmlSchemaSubstGroupPtr substGroup;
    int i;
    int ret = 0;

    elemDecl = (xmlSchemaElementPtr) particle->children;
    /*
    * Wrap the substitution group with a CHOICE.
    */
    start = pctxt->state;
    if (end == NULL)
	end = xmlAutomataNewState(pctxt->am);
    substGroup = xmlSchemaSubstGroupGet(pctxt, elemDecl);
    if (substGroup == NULL) {
	xmlSchemaPErr(pctxt, WXS_ITEM_NODE(particle),
	    XML_SCHEMAP_INTERNAL,
	    "Internal error: xmlSchemaBuildContentModelForSubstGroup, "
	    "declaration is marked having a subst. group but none "
	    "available.\n", elemDecl->name, NULL);
	return(0);
    }
    if (counter >= 0) {
	/*
	* NOTE that we put the declaration in, even if it's abstract.
	* However, an error will be raised during *validation* if an element
	* information item shall be validated against an abstract element
	* declaration.
	*/
	tmp = xmlAutomataNewCountedTrans(pctxt->am, start, NULL, counter);
        xmlAutomataNewTransition2(pctxt->am, tmp, end,
	            elemDecl->name, elemDecl->targetNamespace, elemDecl);
	/*
	* Add subst. group members.
	*/
	for (i = 0; i < substGroup->members->nbItems; i++) {
	    member = (xmlSchemaElementPtr) substGroup->members->items[i];
            xmlAutomataNewTransition2(pctxt->am, tmp, end,
		               member->name, member->targetNamespace, member);
	}
    } else if (particle->maxOccurs == 1) {
	/*
	* NOTE that we put the declaration in, even if it's abstract,
	*/
	xmlAutomataNewEpsilon(pctxt->am,
	    xmlAutomataNewTransition2(pctxt->am,
	    start, NULL,
	    elemDecl->name, elemDecl->targetNamespace, elemDecl), end);
	/*
	* Add subst. group members.
	*/
	for (i = 0; i < substGroup->members->nbItems; i++) {
	    member = (xmlSchemaElementPtr) substGroup->members->items[i];
	    /*
	    * NOTE: This fixes bug #341150. xmlAutomataNewOnceTrans2()
	    *  was incorrectly used instead of xmlAutomataNewTransition2()
	    *  (seems like a copy&paste bug from the XML_SCHEMA_TYPE_ALL
	    *  section in xmlSchemaBuildAContentModel() ).
	    * TODO: Check if xmlAutomataNewOnceTrans2() was instead
	    *  intended for the above "counter" section originally. I.e.,
	    *  check xs:all with subst-groups.
	    *
	    * tmp = xmlAutomataNewOnceTrans2(pctxt->am, start, NULL,
	    *	               member->name, member->targetNamespace,
	    *		       1, 1, member);
	    */
	    tmp = xmlAutomataNewTransition2(pctxt->am, start, NULL,
		member->name, member->targetNamespace, member);
	    xmlAutomataNewEpsilon(pctxt->am, tmp, end);
	}
    } else {
	xmlAutomataStatePtr hop;
	int maxOccurs = particle->maxOccurs == UNBOUNDED ?
	    UNBOUNDED : particle->maxOccurs - 1;
	int minOccurs = particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

	counter =
	    xmlAutomataNewCounter(pctxt->am, minOccurs,
	    maxOccurs);
	hop = xmlAutomataNewState(pctxt->am);

	xmlAutomataNewEpsilon(pctxt->am,
	    xmlAutomataNewTransition2(pctxt->am,
	    start, NULL,
	    elemDecl->name, elemDecl->targetNamespace, elemDecl),
	    hop);
	/*
	 * Add subst. group members.
	 */
	for (i = 0; i < substGroup->members->nbItems; i++) {
	    member = (xmlSchemaElementPtr) substGroup->members->items[i];
	    xmlAutomataNewEpsilon(pctxt->am,
		xmlAutomataNewTransition2(pctxt->am,
		start, NULL,
		member->name, member->targetNamespace, member),
		hop);
	}
	xmlAutomataNewCountedTrans(pctxt->am, hop, start, counter);
	xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
    }
    if (particle->minOccurs == 0) {
	xmlAutomataNewEpsilon(pctxt->am, start, end);
        ret = 1;
    }
    pctxt->state = end;
    return(ret);
}